

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# big_integer_testing.cpp
# Opt level: O1

void __thiscall
correctness_add_long_pow2_Test::~correctness_add_long_pow2_Test
          (correctness_add_long_pow2_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(correctness, add_long_pow2) {
    big_integer a("18446744073709551616");
    big_integer b("-18446744073709551616");
    big_integer c("36893488147419103232");

    EXPECT_EQ(a + a, c);
    EXPECT_EQ(b + c, a);
    EXPECT_EQ(c + b, a);
}